

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool __thiscall
cmInstallCommand::HandleScriptMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  undefined8 this_00;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong uVar5;
  string *psVar6;
  cmInstallScriptGenerator *pcVar7;
  char *pcVar8;
  char *pcVar9;
  cmGlobalGenerator *this_01;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  undefined8 local_f8;
  string *code;
  string local_e8;
  undefined1 local_c8 [8];
  string script;
  string *arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_80;
  ulong local_50;
  size_t i;
  undefined1 local_40;
  bool exclude_from_all;
  bool doing_code;
  bool doing_script;
  int componentCount;
  string component;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmInstallCommand *this_local;
  
  component.field_2._8_8_ = args;
  std::__cxx11::string::string((string *)&local_40,(string *)&this->DefaultComponentName);
  i._4_4_ = 0;
  i._3_1_ = 0;
  i._2_1_ = 0;
  i._1_1_ = 0;
  for (local_50 = 0; uVar5 = local_50,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)component.field_2._8_8_), this_00 = component.field_2._8_8_, uVar5 < sVar3;
      local_50 = local_50 + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)component.field_2._8_8_,local_50);
    bVar2 = std::operator==(pvVar4,"COMPONENT");
    if ((bVar2) &&
       (uVar5 = local_50 + 1,
       sVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)component.field_2._8_8_), uVar5 < sVar3)) {
      i._4_4_ = i._4_4_ + 1;
      local_50 = local_50 + 1;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)component.field_2._8_8_,local_50);
      std::__cxx11::string::operator=((string *)&local_40,(string *)pvVar4);
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)component.field_2._8_8_,local_50);
    bVar2 = std::operator==(pvVar4,"EXCLUDE_FROM_ALL");
    if (bVar2) {
      i._1_1_ = 1;
    }
  }
  if (i._4_4_ < 2) {
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)component.field_2._8_8_);
    arg = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&arg), bVar2) {
      script.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              script.field_2._8_8_,"SCRIPT");
      if (bVar2) {
        i._3_1_ = 1;
        i._2_1_ = 0;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )script.field_2._8_8_,"CODE");
        if (bVar2) {
          i._3_1_ = 0;
          i._2_1_ = 1;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)script.field_2._8_8_,"COMPONENT");
          if (bVar2) {
            i._3_1_ = 0;
            i._2_1_ = 0;
          }
          else if ((i._3_1_ & 1) == 0) {
            if ((i._2_1_ & 1) != 0) {
              i._2_1_ = 0;
              local_f8 = script.field_2._8_8_;
              pcVar1 = (this->super_cmCommand).Makefile;
              pcVar7 = (cmInstallScriptGenerator *)operator_new(0xf0);
              pcVar8 = (char *)std::__cxx11::string::c_str();
              pcVar9 = (char *)std::__cxx11::string::c_str();
              cmInstallScriptGenerator::cmInstallScriptGenerator
                        (pcVar7,pcVar8,true,pcVar9,(bool)(i._1_1_ & 1));
              cmMakefile::AddInstallGenerator(pcVar1,(cmInstallGenerator *)pcVar7);
            }
          }
          else {
            i._3_1_ = 0;
            std::__cxx11::string::string((string *)local_c8,(string *)script.field_2._8_8_);
            bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_c8);
            if (!bVar2) {
              psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                                 ((this->super_cmCommand).Makefile);
              std::__cxx11::string::operator=((string *)local_c8,(string *)psVar6);
              std::__cxx11::string::operator+=((string *)local_c8,"/");
              std::__cxx11::string::operator+=((string *)local_c8,(string *)script.field_2._8_8_);
            }
            bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_c8);
            if (bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e8,"given a directory as value of SCRIPT argument.",
                         (allocator<char> *)((long)&code + 7));
              cmCommand::SetError(&this->super_cmCommand,&local_e8);
              std::__cxx11::string::~string((string *)&local_e8);
              std::allocator<char>::~allocator((allocator<char> *)((long)&code + 7));
              this_local._7_1_ = 0;
            }
            else {
              pcVar1 = (this->super_cmCommand).Makefile;
              pcVar7 = (cmInstallScriptGenerator *)operator_new(0xf0);
              pcVar8 = (char *)std::__cxx11::string::c_str();
              pcVar9 = (char *)std::__cxx11::string::c_str();
              cmInstallScriptGenerator::cmInstallScriptGenerator
                        (pcVar7,pcVar8,false,pcVar9,(bool)(i._1_1_ & 1));
              cmMakefile::AddInstallGenerator(pcVar1,(cmInstallGenerator *)pcVar7);
            }
            __range1._0_4_ = (uint)bVar2;
            std::__cxx11::string::~string((string *)local_c8);
            if ((uint)__range1 != 0) goto LAB_00300981;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    if ((i._3_1_ & 1) == 0) {
      if ((i._2_1_ & 1) == 0) {
        this_01 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        cmGlobalGenerator::AddInstallComponent(this_01,(string *)&local_40);
        this_local._7_1_ = 1;
        __range1._0_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"given no value for CODE argument.",&local_141);
        cmCommand::SetError(&this->super_cmCommand,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::allocator<char>::~allocator(&local_141);
        this_local._7_1_ = 0;
        __range1._0_4_ = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"given no value for SCRIPT argument.",&local_119);
      cmCommand::SetError(&this->super_cmCommand,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      this_local._7_1_ = 0;
      __range1._0_4_ = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,(allocator<char> *)((long)&__range1 + 7));
    cmCommand::SetError(&this->super_cmCommand,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    this_local._7_1_ = 0;
    __range1._0_4_ = 1;
  }
LAB_00300981:
  std::__cxx11::string::~string((string *)&local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmInstallCommand::HandleScriptMode(std::vector<std::string> const& args)
{
  std::string component = this->DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;
  bool exclude_from_all = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMPONENT" && i + 1 < args.size()) {
      ++componentCount;
      ++i;
      component = args[i];
    }
    if (args[i] == "EXCLUDE_FROM_ALL") {
      exclude_from_all = true;
    }
  }

  if (componentCount > 1) {
    this->SetError("given more than one COMPONENT for the SCRIPT or CODE "
                   "signature of the INSTALL command. "
                   "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
  }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for (std::string const& arg : args) {
    if (arg == "SCRIPT") {
      doing_script = true;
      doing_code = false;
    } else if (arg == "CODE") {
      doing_script = false;
      doing_code = true;
    } else if (arg == "COMPONENT") {
      doing_script = false;
      doing_code = false;
    } else if (doing_script) {
      doing_script = false;
      std::string script = arg;
      if (!cmSystemTools::FileIsFullPath(script)) {
        script = this->Makefile->GetCurrentSourceDirectory();
        script += "/";
        script += arg;
      }
      if (cmSystemTools::FileIsDirectory(script)) {
        this->SetError("given a directory as value of SCRIPT argument.");
        return false;
      }
      this->Makefile->AddInstallGenerator(new cmInstallScriptGenerator(
        script.c_str(), false, component.c_str(), exclude_from_all));
    } else if (doing_code) {
      doing_code = false;
      std::string const& code = arg;
      this->Makefile->AddInstallGenerator(new cmInstallScriptGenerator(
        code.c_str(), true, component.c_str(), exclude_from_all));
    }
  }

  if (doing_script) {
    this->SetError("given no value for SCRIPT argument.");
    return false;
  }
  if (doing_code) {
    this->SetError("given no value for CODE argument.");
    return false;
  }

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}